

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

void __thiscall
QHttpNetworkRequest::QHttpNetworkRequest
          (QHttpNetworkRequest *this,QUrl *url,Operation operation,Priority priority)

{
  QHttpNetworkRequestPrivate *this_00;
  QHttpNetworkHeader *in_RDI;
  QHttpNetworkRequestPrivate *in_stack_ffffffffffffffc8;
  QHttpNetworkHeader *pQVar1;
  
  QHttpNetworkHeader::QHttpNetworkHeader(in_RDI);
  in_RDI->_vptr_QHttpNetworkHeader = (_func_int **)&PTR__QHttpNetworkRequest_0049e558;
  pQVar1 = in_RDI + 1;
  this_00 = (QHttpNetworkRequestPrivate *)operator_new(0xd0);
  QHttpNetworkRequestPrivate::QHttpNetworkRequestPrivate
            (this_00,(Operation)((ulong)pQVar1 >> 0x20),(Priority)pQVar1,(QUrl *)in_RDI);
  QSharedDataPointer<QHttpNetworkRequestPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

QHttpNetworkRequest::QHttpNetworkRequest(const QUrl &url, Operation operation, Priority priority)
    : d(new QHttpNetworkRequestPrivate(operation, priority, url))
{
}